

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O3

void __thiscall
tcu::Texture1DArray::Texture1DArray
          (Texture1DArray *this,TextureFormat *format,int width,int numLayers)

{
  ConstPixelBufferAccess *pCVar1;
  uint uVar2;
  
  uVar2 = 0x20;
  if (width != 0) {
    uVar2 = 0x1f;
    if (width != 0) {
      for (; (uint)width >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    uVar2 = uVar2 ^ 0x1f;
  }
  TextureLevelPyramid::TextureLevelPyramid(&this->super_TextureLevelPyramid,format,0x20 - uVar2);
  this->m_width = width;
  this->m_numLayers = numLayers;
  pCVar1 = &((this->super_TextureLevelPyramid).m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess;
  (this->m_view).m_numLevels =
       (int)((ulong)((long)(this->super_TextureLevelPyramid).m_access.
                           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1) >> 3) *
       -0x33333333;
  (this->m_view).m_levels = pCVar1;
  return;
}

Assistant:

Texture1DArray::Texture1DArray (const TextureFormat& format, int width, int numLayers)
	: TextureLevelPyramid	(format, computeMipPyramidLevels(width))
	, m_width				(width)
	, m_numLayers			(numLayers)
	, m_view				(getNumLevels(), getLevels())
{
}